

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void trimFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  byte bVar1;
  int iVar2;
  void *pvVar3;
  byte *pbVar4;
  uint local_68;
  uint local_64;
  int len_1;
  int len;
  uchar *z;
  uchar **ppuStack_50;
  int nChar;
  uchar **azChar;
  uchar *aLen;
  int i;
  int flags;
  int nIn;
  uchar *zCharSet;
  uchar *zIn;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *context_local;
  
  azChar = (uchar **)0x0;
  ppuStack_50 = (uchar **)0x0;
  iVar2 = sqlite3_value_type(*argv);
  if ((iVar2 != 5) && (zCharSet = sqlite3_value_text(*argv), zCharSet != (uchar *)0x0)) {
    i = sqlite3_value_bytes(*argv);
    if (argc == 1) {
      z._4_4_ = 1;
      azChar = (uchar **)trimFunc::lenOne;
      ppuStack_50 = trimFunc::azOne;
      _flags = (byte *)0x0;
    }
    else {
      _flags = sqlite3_value_text(argv[1]);
      if (_flags == (byte *)0x0) {
        return;
      }
      z._4_4_ = 0;
      _len_1 = _flags;
      while (*_len_1 != 0) {
        pbVar4 = _len_1 + 1;
        bVar1 = *_len_1;
        _len_1 = pbVar4;
        if (0xbf < bVar1) {
          for (; (*_len_1 & 0xc0) == 0x80; _len_1 = _len_1 + 1) {
          }
        }
        z._4_4_ = z._4_4_ + 1;
      }
      if (0 < z._4_4_) {
        ppuStack_50 = (uchar **)contextMalloc(context,(long)z._4_4_ * 9);
        if (ppuStack_50 == (uchar **)0x0) {
          return;
        }
        azChar = ppuStack_50 + z._4_4_;
        z._4_4_ = 0;
        _len_1 = _flags;
        while (*_len_1 != 0) {
          ppuStack_50[z._4_4_] = _len_1;
          pbVar4 = _len_1 + 1;
          bVar1 = *_len_1;
          _len_1 = pbVar4;
          if (0xbf < bVar1) {
            for (; (*_len_1 & 0xc0) == 0x80; _len_1 = _len_1 + 1) {
            }
          }
          *(char *)((long)azChar + (long)z._4_4_) = (char)_len_1 - (char)ppuStack_50[z._4_4_];
          z._4_4_ = z._4_4_ + 1;
        }
      }
    }
    if (0 < z._4_4_) {
      pvVar3 = sqlite3_user_data(context);
      if (((ulong)pvVar3 & 1) != 0) {
        for (; 0 < i; i = i - local_64) {
          local_64 = 0;
          aLen._4_4_ = 0;
          while ((aLen._4_4_ < z._4_4_ &&
                 ((local_64 = (uint)*(byte *)((long)azChar + (long)aLen._4_4_), i < (int)local_64 ||
                  (iVar2 = memcmp(zCharSet,ppuStack_50[aLen._4_4_],(long)(int)local_64), iVar2 != 0)
                  )))) {
            aLen._4_4_ = aLen._4_4_ + 1;
          }
          if (z._4_4_ <= aLen._4_4_) break;
          zCharSet = zCharSet + (int)local_64;
        }
      }
      if (((ulong)pvVar3 & 2) != 0) {
        for (; 0 < i; i = i - local_68) {
          local_68 = 0;
          aLen._4_4_ = 0;
          while ((aLen._4_4_ < z._4_4_ &&
                 ((local_68 = (uint)*(byte *)((long)azChar + (long)aLen._4_4_), i < (int)local_68 ||
                  (iVar2 = memcmp(zCharSet + (int)(i - local_68),ppuStack_50[aLen._4_4_],
                                  (long)(int)local_68), iVar2 != 0))))) {
            aLen._4_4_ = aLen._4_4_ + 1;
          }
          if (z._4_4_ <= aLen._4_4_) break;
        }
      }
      if (_flags != (byte *)0x0) {
        sqlite3_free(ppuStack_50);
      }
    }
    sqlite3_result_text(context,(char *)zCharSet,i,(_func_void_void_ptr *)0xffffffffffffffff);
  }
  return;
}

Assistant:

static void trimFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const unsigned char *zIn;         /* Input string */
  const unsigned char *zCharSet;    /* Set of characters to trim */
  int nIn;                          /* Number of bytes in input */
  int flags;                        /* 1: trimleft  2: trimright  3: trim */
  int i;                            /* Loop counter */
  unsigned char *aLen = 0;          /* Length of each character in zCharSet */
  unsigned char **azChar = 0;       /* Individual characters in zCharSet */
  int nChar;                        /* Number of characters in zCharSet */

  if( sqlite3_value_type(argv[0])==SQLITE_NULL ){
    return;
  }
  zIn = sqlite3_value_text(argv[0]);
  if( zIn==0 ) return;
  nIn = sqlite3_value_bytes(argv[0]);
  assert( zIn==sqlite3_value_text(argv[0]) );
  if( argc==1 ){
    static const unsigned char lenOne[] = { 1 };
    static unsigned char * const azOne[] = { (u8*)" " };
    nChar = 1;
    aLen = (u8*)lenOne;
    azChar = (unsigned char **)azOne;
    zCharSet = 0;
  }else if( (zCharSet = sqlite3_value_text(argv[1]))==0 ){
    return;
  }else{
    const unsigned char *z;
    for(z=zCharSet, nChar=0; *z; nChar++){
      SQLITE_SKIP_UTF8(z);
    }
    if( nChar>0 ){
      azChar = contextMalloc(context, ((i64)nChar)*(sizeof(char*)+1));
      if( azChar==0 ){
        return;
      }
      aLen = (unsigned char*)&azChar[nChar];
      for(z=zCharSet, nChar=0; *z; nChar++){
        azChar[nChar] = (unsigned char *)z;
        SQLITE_SKIP_UTF8(z);
        aLen[nChar] = (u8)(z - azChar[nChar]);
      }
    }
  }
  if( nChar>0 ){
    flags = SQLITE_PTR_TO_INT(sqlite3_user_data(context));
    if( flags & 1 ){
      while( nIn>0 ){
        int len = 0;
        for(i=0; i<nChar; i++){
          len = aLen[i];
          if( len<=nIn && memcmp(zIn, azChar[i], len)==0 ) break;
        }
        if( i>=nChar ) break;
        zIn += len;
        nIn -= len;
      }
    }
    if( flags & 2 ){
      while( nIn>0 ){
        int len = 0;
        for(i=0; i<nChar; i++){
          len = aLen[i];
          if( len<=nIn && memcmp(&zIn[nIn-len],azChar[i],len)==0 ) break;
        }
        if( i>=nChar ) break;
        nIn -= len;
      }
    }
    if( zCharSet ){
      sqlite3_free(azChar);
    }
  }
  sqlite3_result_text(context, (char*)zIn, nIn, SQLITE_TRANSIENT);
}